

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

int main(int argc,char **argv)

{
  socklen_t __len;
  bool bVar1;
  ptls_key_exchange_algorithm_t **pppVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int extraout_EAX;
  FILE *pFVar7;
  EVP_PKEY *pEVar8;
  FILE *pFVar9;
  ptls_key_exchange_algorithm_t **pppVar10;
  FILE *pFVar11;
  FILE *pFVar12;
  ptls_esni_context_t *esni;
  uint8_t *puVar13;
  ptls_key_exchange_algorithm_t *ppVar14;
  size_t sVar15;
  FILE *__stream;
  ulong __n;
  ptls_key_exchange_context_t **ctx;
  char *pcVar16;
  long lVar17;
  byte *__dest;
  FILE *input_file;
  byte *pbVar18;
  bool bVar19;
  ptls_iovec_t esni_keys;
  ptls_handshake_properties_t hsprop;
  sockaddr_storage sa;
  ns_msg msg;
  anon_struct_136_2_ecfa8f33 esni_key_exchanges;
  char esni_name [256];
  ptls_key_exchange_algorithm_t *key_exchanges [128];
  uint8_t answer [1024];
  int on;
  FILE *pFStack_10c20;
  ptls_buffer_t pStack_10c08;
  undefined1 auStack_10be8 [32];
  size_t *psStack_10bc8;
  undefined8 uStack_10bc0;
  undefined8 uStack_10bb8;
  undefined8 uStack_10bb0;
  undefined8 uStack_10ba8;
  undefined8 uStack_10ba0;
  undefined8 uStack_10b98;
  undefined8 uStack_10b90;
  undefined8 uStack_10b88;
  ptls_raw_extension_t *ppStack_10b80;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *p_Stack_10b78;
  _func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *p_Stack_10b70;
  ptls_context_t pStack_10b68;
  ptls_base64_decode_state_t pStack_10aa0;
  sockaddr asStack_10a90 [8];
  ns_msg anStack_10a10 [2];
  ptls_key_exchange_context_t *appStack_109c0 [16];
  long lStack_10940;
  char acStack_10938 [256];
  ptls_key_exchange_algorithm_t *appStack_10838 [128];
  addrinfo *apaStack_10438 [128];
  undefined1 auStack_10038 [32];
  char *pcStack_10018;
  addrinfo *paStack_10010;
  ushort local_fc2c;
  byte *local_fc28;
  
  bVar1 = false;
  OPENSSL_init_crypto(2);
  OPENSSL_init_crypto(0xc);
  ENGINE_load_builtin_engines();
  ENGINE_register_all_ciphers();
  ENGINE_register_all_digests();
  __res_init();
  memset(appStack_10838,0,0x400);
  memset(&pStack_10b68.certificates,0,0xa8);
  pStack_10b68.random_bytes = ptls_openssl_random_bytes;
  pStack_10b68.get_time = &ptls_get_time;
  pStack_10b68.cipher_suites = ptls_openssl_cipher_suites;
  p_Stack_10b78 = (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_uint16_t *)0x0;
  p_Stack_10b70 =
       (_func_int_ptls_t_ptr_st_ptls_handshake_properties_t_ptr_ptls_raw_extension_t_ptr *)0x0;
  uStack_10b88 = 0;
  ppStack_10b80 = (ptls_raw_extension_t *)0x0;
  uStack_10b98 = (uint8_t *)0x0;
  uStack_10b90 = 0;
  uStack_10ba8 = 0;
  uStack_10ba0 = (void *)0x0;
  uStack_10bb8 = (uint8_t *)0x0;
  uStack_10bb0 = 0;
  psStack_10bc8 = (size_t *)0x0;
  uStack_10bc0 = 0;
  auStack_10be8._16_8_ = (uint8_t *)0x0;
  auStack_10be8._24_8_ = (FILE *)0x0;
  auStack_10be8._0_8_ = (ptls_iovec_t *)0x0;
  auStack_10be8._8_8_ = 0;
  __stream = (FILE *)0x0;
  bVar19 = false;
  pFStack_10c20 = (FILE *)0x0;
  input_file = (FILE *)0x0;
  iVar6 = 0;
  pStack_10b68.key_exchanges = appStack_10838;
LAB_00106083:
  iVar3 = iVar6;
  uVar4 = getopt(argc,argv,"46abC:c:i:k:nN:es:SE:K:l:vh");
  iVar5 = _optind;
  pFVar11 = _optarg;
  pFVar7 = (FILE *)(ulong)uVar4;
  pFVar9 = (FILE *)argv;
  iVar6 = iVar3;
  if ((int)uVar4 < 0x4e) {
    if (0x42 < (int)uVar4) {
      if (uVar4 == 0x43) {
switchD_001060bc_caseD_63:
        if (pStack_10b68.certificates.count != 0) {
          main_cold_8();
          goto LAB_00106a35;
        }
        iVar5 = ptls_load_certificates(&pStack_10b68,(char *)_optarg);
        if (iVar5 != 0) {
          main_cold_9();
          pFVar9 = pFVar11;
LAB_00106a58:
          main_cold_5();
switchD_001060bc_caseD_68:
          usage(*(char **)pFVar9);
          exit(0);
        }
        bVar19 = uVar4 == 99;
      }
      else if (uVar4 == 0x45) {
        pFStack_10c20 = _optarg;
      }
      else {
        if (uVar4 != 0x4b) goto switchD_001060bc_caseD_64;
        pFVar7 = fopen((char *)_optarg,"rt");
        if (pFVar7 == (FILE *)0x0) {
          main_cold_4();
          goto LAB_00106a35;
        }
        pEVar8 = PEM_read_PrivateKey(pFVar7,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
        if (pEVar8 == (EVP_PKEY *)0x0) {
          main_cold_3();
          goto LAB_00106a35;
        }
        ctx = appStack_109c0 + lStack_10940;
        lStack_10940 = lStack_10940 + 1;
        iVar5 = ptls_openssl_create_key_exchange(ctx,(EVP_PKEY *)pEVar8);
        if (iVar5 != 0) {
          main_cold_2();
          goto LAB_00106a35;
        }
        EVP_PKEY_free(pEVar8);
        fclose(pFVar7);
      }
      goto LAB_00106083;
    }
    iVar6 = 2;
    if (uVar4 == 0x34) goto LAB_00106083;
    if (uVar4 == 0x36) {
      iVar6 = 10;
      goto LAB_00106083;
    }
    if (uVar4 != 0xffffffff) goto switchD_001060bc_caseD_64;
    if ((pStack_10b68.sign_certificate != (ptls_sign_certificate_t *)0x0) ==
        (pStack_10b68.certificates.count == 0)) {
      main_cold_10();
      goto LAB_00106a35;
    }
    lVar17 = (long)_optind;
    if (bVar19) {
      if (pStack_10b68.certificates.count == 0) {
        main_cold_12();
        goto LAB_00106a35;
      }
      if (pStack_10b68.decompress_certificate != (ptls_decompress_certificate_t *)0x0) {
        iVar6 = ptls_init_compressed_certificate
                          (&main::ecc,pStack_10b68.certificates.list,pStack_10b68.certificates.count
                           ,(ptls_iovec_t)ZEXT816(0));
        if (iVar6 != 0) {
          main_cold_11();
          goto LAB_00106af3;
        }
        pStack_10b68.emit_certificate = &main::ecc.super;
      }
      setup_session_cache_sc._0_8_ = encrypt_ticket_cb;
      pStack_10b68.ticket_lifetime = 0x15180;
      pStack_10b68.max_early_data_size = 0x2000;
      pStack_10b68.encrypt_ticket = (ptls_encrypt_ticket_t *)setup_session_cache_sc;
    }
    else if (bVar1) {
      psStack_10bc8 = &main::max_early_data_size;
    }
    if (appStack_10838[0] == (ptls_key_exchange_algorithm_t *)0x0) {
      appStack_10838[0] = &ptls_openssl_secp256r1;
    }
    if (pFStack_10c20 == (FILE *)0x0) {
LAB_00106640:
      if (argc - iVar5 != 2) {
        main_cold_18();
        goto LAB_00106a35;
      }
      pFVar7 = (FILE *)argv[lVar17];
      pFVar9 = (FILE *)argv[lVar17 + 1];
      auStack_10038._16_8_ = 0;
      auStack_10038._24_8_ = (sockaddr *)0x0;
      pcStack_10018 = (char *)0x0;
      paStack_10010 = (addrinfo *)0x0;
      auStack_10038._8_4_ = 1;
      auStack_10038._12_4_ = 6;
      auStack_10038._0_4_ = 0x421;
      auStack_10038._4_4_ = iVar3;
      iVar6 = getaddrinfo((char *)pFVar7,(char *)pFVar9,(addrinfo *)auStack_10038,apaStack_10438);
      if ((iVar6 != 0) || (apaStack_10438[0] == (addrinfo *)0x0)) goto LAB_00106a96;
      memcpy(asStack_10a90,apaStack_10438[0]->ai_addr,(ulong)apaStack_10438[0]->ai_addrlen);
      __len = apaStack_10438[0]->ai_addrlen;
      freeaddrinfo(apaStack_10438[0]);
      if (bVar19) {
        auStack_10038._0_4_ = 1;
        iVar6 = socket((uint)asStack_10a90[0].sa_family,1,0);
        if (iVar6 == -1) goto LAB_00106920;
        iVar5 = setsockopt(iVar6,1,2,auStack_10038,4);
        if (iVar5 == 0) {
          iVar5 = bind(iVar6,asStack_10a90,__len);
          if (iVar5 == 0) {
            iVar5 = listen(iVar6,0x1000);
            if (iVar5 == 0) {
              do {
                do {
                  iVar5 = accept(iVar6,(sockaddr *)0x0,(socklen_t *)0x0);
                } while (iVar5 == -1);
                handle_connection(iVar5,&pStack_10b68,(char *)0x0,(char *)input_file,
                                  (ptls_handshake_properties_t *)auStack_10be8,(int)__stream);
              } while( true );
            }
            pcVar16 = "listen(2) failed";
          }
          else {
            pcVar16 = "bind(2) failed";
          }
        }
        else {
          pcVar16 = "setsockopt(SO_REUSEADDR) failed";
        }
        goto LAB_00106956;
      }
      pStack_10c08.base = "";
      pStack_10c08.capacity = 0;
      pStack_10c08.off = 0;
      pStack_10c08.is_allocated = 0;
      uVar4 = snprintf(acStack_10938,0x100,"_esni.%s");
      if ((((0xff < uVar4) ||
           (iVar6 = res_query(acStack_10938,1,0x10,apaStack_10438,0x400), iVar6 < 1)) ||
          (iVar6 = ns_initparse((u_char *)apaStack_10438,iVar6,anStack_10a10), iVar6 != 0)) ||
         (((anStack_10a10[0]._22_2_ == 0 ||
           (iVar6 = ns_parserr(anStack_10a10,ns_s_an,0,(ns_rr *)auStack_10038), iVar6 != 0)) ||
          ((ulong)local_fc2c == 0)))) goto LAB_0010684f;
      __dest = local_fc28;
      pbVar18 = local_fc28;
      goto LAB_00106989;
    }
    if (lStack_10940 == 0) {
      main_cold_17();
      goto LAB_00106a35;
    }
    pFVar11 = fopen((char *)pFStack_10c20,"rb");
    if (pFVar11 != (FILE *)0x0) {
      pFVar12 = (FILE *)fread(auStack_10038,1,0x10000,pFVar11);
      if ((pFVar12 == (FILE *)0x0) || (iVar6 = feof(pFVar11), pFVar7 = pFVar12, iVar6 == 0))
      goto LAB_00106a87;
      fclose(pFVar11);
      pFVar11 = (FILE *)malloc(0x10);
      pStack_10b68.esni = (ptls_esni_context_t **)pFVar11;
      if (pFVar11 != (FILE *)0x0) {
        esni = (ptls_esni_context_t *)malloc(0x28);
        *(ptls_esni_context_t **)pFVar11 = esni;
        pFVar9 = pFVar11;
        if (esni != (ptls_esni_context_t *)0x0) {
          esni_keys.len = (size_t)pFVar12;
          esni_keys.base = auStack_10038;
          iVar6 = ptls_esni_init_context(&pStack_10b68,esni,esni_keys,appStack_109c0);
          if (iVar6 == 0) goto LAB_00106640;
          goto LAB_00106aba;
        }
      }
      goto LAB_00106a91;
    }
    main_cold_16();
LAB_00106aba:
    main_cold_13();
LAB_00106ac6:
    pcVar16 = "getaddrinfo returned NULL";
  }
  else {
    switch(uVar4) {
    case 0x61:
      pStack_10b68._104_1_ = pStack_10b68._104_1_ | 8;
      goto LAB_00106083;
    case 0x62:
      pStack_10b68.decompress_certificate = &ptls_decompress_certificate;
      goto LAB_00106083;
    case 99:
      goto switchD_001060bc_caseD_63;
    case 100:
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6d:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
      goto switchD_001060bc_caseD_64;
    case 0x65:
      bVar1 = true;
      goto LAB_00106083;
    case 0x68:
      goto switchD_001060bc_caseD_68;
    case 0x69:
      input_file = _optarg;
      goto LAB_00106083;
    case 0x6b:
      pFVar9 = fopen((char *)_optarg,"rb");
      pFVar7 = pFVar11;
      if (pFVar9 == (FILE *)0x0) {
        main_cold_7();
        pFVar9 = (FILE *)argv;
        goto LAB_00106a77;
      }
      pEVar8 = PEM_read_PrivateKey(pFVar9,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      fclose(pFVar9);
      if (pEVar8 != (EVP_PKEY *)0x0) {
        ptls_openssl_init_sign_certificate
                  ((ptls_openssl_sign_certificate_t *)load_private_key_sc,(EVP_PKEY *)pEVar8);
        EVP_PKEY_free(pEVar8);
        pStack_10b68.sign_certificate = (ptls_sign_certificate_t *)load_private_key_sc;
        goto LAB_00106083;
      }
      break;
    case 0x6c:
      setup_log_event_ls._8_8_ = fopen((char *)_optarg,"at");
      pFVar9 = pFVar11;
      if ((FILE *)setup_log_event_ls._8_8_ != (FILE *)0x0) {
        setup_log_event_ls._0_8_ = log_event_cb;
        pStack_10b68.log_event = (ptls_log_event_t *)setup_log_event_ls;
        goto LAB_00106083;
      }
LAB_00106a77:
      main_cold_1();
      break;
    case 0x6e:
      uStack_10bc0 = uStack_10bc0 | 0x100000000;
      goto LAB_00106083;
    case 0x73:
      strcpy(setup_session_file_st + 8,(char *)_optarg);
      setup_session_file_st._0_8_ = util_save_ticket_cb;
      pStack_10b68.save_ticket = (ptls_save_ticket_t *)setup_session_file_st;
      pFVar7 = fopen((char *)pFVar11,"rb");
      if (pFVar7 != (FILE *)0x0) {
        pFVar11 = (FILE *)fread(setup_session_file_ticket,1,0x4000,pFVar7);
        if ((pFVar11 == (FILE *)0x0) || (iVar5 = feof(pFVar7), pFVar9 = pFVar11, iVar5 == 0))
        goto LAB_00106a58;
        fclose(pFVar7);
        auStack_10be8._16_8_ = setup_session_file_ticket;
        auStack_10be8._24_8_ = pFVar11;
      }
      goto LAB_00106083;
    case 0x75:
      __stream = (FILE *)0x1;
      goto LAB_00106083;
    case 0x76:
      ptls_openssl_init_verify_certificate
                ((ptls_openssl_verify_certificate_t *)setup_verify_certificate_vc,(X509_STORE *)0x0)
      ;
      pStack_10b68.verify_certificate = (ptls_verify_certificate_t *)setup_verify_certificate_vc;
      goto LAB_00106083;
    default:
      if (uVar4 == 0x4e) {
        iVar5 = strcasecmp((char *)_optarg,"secp256r1");
        ppVar14 = &ptls_openssl_secp256r1;
        if (iVar5 == 0) goto LAB_0010645f;
        iVar5 = strcasecmp((char *)pFVar11,"secp384r1");
        ppVar14 = &ptls_openssl_secp384r1;
        if (iVar5 != 0) {
          iVar5 = strcasecmp((char *)pFVar11,"secp521r1");
          ppVar14 = &ptls_openssl_secp521r1;
          if (iVar5 != 0) {
            iVar5 = strcasecmp((char *)pFVar11,"x25519");
            ppVar14 = &ptls_openssl_x25519;
            if (iVar5 != 0) {
              fprintf(_stderr,"could not find key exchange: %s\n",pFVar11);
              goto LAB_00106a35;
            }
          }
        }
LAB_0010645f:
        pppVar2 = appStack_10838;
        do {
          pppVar10 = pppVar2;
          pppVar2 = pppVar10 + 1;
        } while (*pppVar10 != (ptls_key_exchange_algorithm_t *)0x0);
        *pppVar10 = ppVar14;
      }
      else {
        if (uVar4 != 0x53) goto switchD_001060bc_caseD_64;
        pStack_10b68._104_1_ = pStack_10b68._104_1_ | 1;
      }
      goto LAB_00106083;
    }
    main_cold_6();
LAB_00106a87:
    main_cold_15();
LAB_00106a91:
    main_cold_14();
    iVar6 = extraout_EAX;
LAB_00106a96:
    __stream = _stderr;
    if (iVar6 == 0) goto LAB_00106ac6;
    pcVar16 = gai_strerror(iVar6);
  }
  fprintf(__stream,"failed to resolve address:%s:%s:%s\n",pFVar7,pFVar9,pcVar16);
switchD_001060bc_caseD_64:
  exit(1);
  while( true ) {
    memmove(__dest,pbVar18,__n);
    __dest = __dest + __n;
    pbVar18 = pbVar18 + __n;
    if (pbVar18 == local_fc28 + local_fc2c) break;
LAB_00106989:
    __n = (ulong)*pbVar18;
    pbVar18 = pbVar18 + 1;
    if ((ulong)((long)(local_fc28 + local_fc2c) - (long)pbVar18) < __n) goto LAB_0010684f;
  }
  *__dest = 0;
  ptls_base64_decode_init(&pStack_10aa0);
  iVar6 = ptls_base64_decode((char *)local_fc28,&pStack_10aa0,&pStack_10c08);
  if (iVar6 == 0) {
    puVar13 = pStack_10c08.base;
    sVar15 = pStack_10c08.off;
    if (pStack_10c08.is_allocated == 0) {
LAB_00106af3:
      __assert_fail("decode_buf.is_allocated",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/util.h",
                    0x141,"ptls_iovec_t resolve_esni_keys(const char *)");
    }
  }
  else {
LAB_0010684f:
    ptls_buffer__release_memory(&pStack_10c08);
    puVar13 = (uint8_t *)0x0;
    sVar15 = 0;
  }
  uStack_10bb8 = puVar13;
  uStack_10bb0 = sVar15;
  iVar6 = socket((uint)asStack_10a90[0].sa_family,1,0);
  if (iVar6 == 1) {
LAB_00106920:
    pcVar16 = "socket(2) failed";
LAB_00106956:
    iVar6 = 1;
    perror(pcVar16);
  }
  else {
    iVar5 = connect(iVar6,asStack_10a90,__len);
    if (iVar5 == 0) {
      iVar6 = handle_connection(iVar6,&pStack_10b68,(char *)pFVar7,(char *)input_file,
                                (ptls_handshake_properties_t *)auStack_10be8,(int)__stream);
      free((void *)uStack_10bb8);
    }
    else {
      perror("connect(2) failed");
LAB_00106a35:
      iVar6 = 1;
    }
  }
  return iVar6;
}

Assistant:

int main(int argc, char **argv)
{
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    res_init();

    ptls_key_exchange_algorithm_t *key_exchanges[128] = {NULL};
    ptls_context_t ctx = {ptls_openssl_random_bytes, &ptls_get_time, key_exchanges, ptls_openssl_cipher_suites};
    ptls_handshake_properties_t hsprop = {{{{NULL}}}};
    const char *host, *port, *file = NULL, *esni_file = NULL;
    struct {
        ptls_key_exchange_context_t *elements[16];
        size_t count;
    } esni_key_exchanges;
    int is_server = 0, use_early_data = 0, request_key_update = 0, ch;
    struct sockaddr_storage sa;
    socklen_t salen;
    int family = 0;

    while ((ch = getopt(argc, argv, "46abC:c:i:k:nN:es:SE:K:l:vh")) != -1) {
        switch (ch) {
        case '4':
            family = AF_INET;
            break;
        case '6':
            family = AF_INET6;
            break;
        case 'a':
            ctx.require_client_authentication = 1;
            break;
        case 'b':
#if PICOTLS_USE_BROTLI
            ctx.decompress_certificate = &ptls_decompress_certificate;
#else
            fprintf(stderr, "support for `-b` option was turned off during configuration\n");
            exit(1);
#endif
            break;
        case 'C':
        case 'c':
            if (ctx.certificates.count != 0) {
                fprintf(stderr, "-C/-c can only be specified once\n");
                return 1;
            }
            load_certificate_chain(&ctx, optarg);
            is_server = ch == 'c';
            break;
        case 'i':
            file = optarg;
            break;
        case 'k':
            load_private_key(&ctx, optarg);
            break;
        case 'n':
            hsprop.client.negotiate_before_key_exchange = 1;
            break;
        case 'e':
            use_early_data = 1;
            break;
        case 's':
            setup_session_file(&ctx, &hsprop, optarg);
            break;
        case 'S':
            ctx.require_dhe_on_psk = 1;
            break;
        case 'E':
            esni_file = optarg;
            break;
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;
            int ret;
            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open ESNI private key file:%s:%s\n", optarg, strerror(errno));
                return 1;
            }
            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to load private key from file:%s\n", optarg);
                return 1;
            }
            if ((ret = ptls_openssl_create_key_exchange(esni_key_exchanges.elements + esni_key_exchanges.count++, pkey)) != 0) {
                fprintf(stderr, "failed to load private key from file:%s:picotls-error:%d", optarg, ret);
                return 1;
            }
            EVP_PKEY_free(pkey);
            fclose(fp);
        } break;
        case 'l':
            setup_log_event(&ctx, optarg);
            break;
        case 'v':
            setup_verify_certificate(&ctx);
            break;
        case 'N': {
            ptls_key_exchange_algorithm_t *algo = NULL;
#define MATCH(name)                                                                                                                \
    if (algo == NULL && strcasecmp(optarg, #name) == 0)                                                                            \
    algo = (&ptls_openssl_##name)
            MATCH(secp256r1);
#if PTLS_OPENSSL_HAVE_SECP384R1
            MATCH(secp384r1);
#endif
#if PTLS_OPENSSL_HAVE_SECP521R1
            MATCH(secp521r1);
#endif
#if PTLS_OPENSSL_HAVE_X25519
            MATCH(x25519);
#endif
#undef MATCH
            if (algo == NULL) {
                fprintf(stderr, "could not find key exchange: %s\n", optarg);
                return 1;
            }
            size_t i;
            for (i = 0; key_exchanges[i] != NULL; ++i)
                ;
            key_exchanges[i++] = algo;
        } break;
        case 'u':
            request_key_update = 1;
            break;
        case 'h':
            usage(argv[0]);
            exit(0);
        default:
            exit(1);
        }
    }
    argc -= optind;
    argv += optind;
    if ((ctx.certificates.count == 0) != (ctx.sign_certificate == NULL)) {
        fprintf(stderr, "-C/-c and -k options must be used together\n");
        return 1;
    }
    if (is_server) {
        if (ctx.certificates.count == 0) {
            fprintf(stderr, "-c and -k options must be set\n");
            return 1;
        }
#if PICOTLS_USE_BROTLI
        if (ctx.decompress_certificate != NULL) {
            static ptls_emit_compressed_certificate_t ecc;
            if (ptls_init_compressed_certificate(&ecc, ctx.certificates.list, ctx.certificates.count, ptls_iovec_init(NULL, 0)) !=
                0) {
                fprintf(stderr, "failed to create a brotli-compressed version of the certificate chain.\n");
                exit(1);
            }
            ctx.emit_certificate = &ecc.super;
        }
#endif
        setup_session_cache(&ctx);
    } else {
        /* client */
        if (use_early_data) {
            static size_t max_early_data_size;
            hsprop.client.max_early_data_size = &max_early_data_size;
        }
    }
    if (key_exchanges[0] == NULL)
        key_exchanges[0] = &ptls_openssl_secp256r1;
    if (esni_file != NULL) {
        if (esni_key_exchanges.count == 0) {
            fprintf(stderr, "-E must be used together with -K\n");
            return 1;
        }
        setup_esni(&ctx, esni_file, esni_key_exchanges.elements);
    }
    if (argc != 2) {
        fprintf(stderr, "missing host and port\n");
        return 1;
    }
    host = (--argc, *argv++);
    port = (--argc, *argv++);

    if (resolve_address((struct sockaddr *)&sa, &salen, host, port, family, SOCK_STREAM, IPPROTO_TCP) != 0)
        exit(1);

    if (is_server) {
        return run_server((struct sockaddr *)&sa, salen, &ctx, file, &hsprop, request_key_update);
    } else {
        return run_client((struct sockaddr *)&sa, salen, &ctx, host, file, &hsprop, request_key_update);
    }
}